

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:186:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:186:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ExceptionOr<unsigned_long> depResult;
  uint local_5dc;
  ExceptionOr<kj::String> local_5d8;
  Exception local_458;
  ExceptionOrValue local_2f8;
  char local_198;
  char *local_190;
  Exception local_188;
  
  local_2f8.exception.ptr.isSet = false;
  local_198 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_2f8);
  uVar7 = local_2f8.exception.ptr.field_1.value.context.ptr.ptr;
  uVar6 = local_2f8.exception.ptr.field_1.value.description.content.size_;
  uVar5 = local_2f8.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_2f8.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_2f8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_2f8.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_2f8.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_2f8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_2f8.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_2f8.exception.ptr.field_1.value.file;
    local_188.line = local_2f8.exception.ptr.field_1.value.line;
    local_188.type = local_2f8.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_2f8.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_2f8.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_2f8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_2f8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_2f8.exception.ptr.field_1.value.context.ptr.ptr;
    local_2f8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_458.ownFile.content.ptr = (char *)uVar1;
    local_458.ownFile.content.size_ = uVar2;
    local_458.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_458.file = local_2f8.exception.ptr.field_1.value.file;
    local_458.line = local_2f8.exception.ptr.field_1.value.line;
    local_458.type = local_2f8.exception.ptr.field_1.value.type;
    local_458.description.content.ptr = (char *)uVar5;
    local_458.description.content.size_ = uVar6;
    local_458.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_458.context.ptr.disposer = local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_458.context.ptr.ptr = (Context *)uVar7;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_458.trace,__src,0x104);
    local_5d8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1
    ;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_458.ownFile.content.ptr = (char *)0x0;
    local_458.ownFile.content.size_ = 0;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_2f8.exception.ptr.field_1.value.file;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_2f8.exception.ptr.field_1._32_8_;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar5;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar6;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_458.description.content.ptr = (char *)0x0;
    local_458.description.content.size_ = 0;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar7;
    local_458.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5d8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5d8.value.ptr.isSet = false;
    Exception::~Exception(&local_458);
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_5d8);
    uVar2 = local_5d8.value.ptr.field_1.value.content.size_;
    uVar1 = local_5d8.value.ptr.field_1.value.content.ptr;
    if ((local_5d8.value.ptr.isSet == true) &&
       (local_5d8.value.ptr.field_1.value.content.ptr != (char *)0x0)) {
      local_5d8.value.ptr.field_1.value.content.ptr = (char *)0x0;
      local_5d8.value.ptr.field_1.value.content.size_ = 0;
      (**(local_5d8.value.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_5d8.value.ptr.field_1.value.content.disposer,uVar1,1,uVar2,uVar2,0);
    }
    if (local_5d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (local_198 == '\x01') {
    local_188.ownFile.content.ptr = local_190;
    if ((local_190 != (char *)0x3) && (Debug::minSeverity < 3)) {
      local_5dc = 3;
      Debug::log<char_const(&)[29],unsigned_int,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xbb,ERROR,"\"failed: expected \" \"(3u) == (n)\", 3u, n",
                 (char (*) [29])"failed: expected (3u) == (n)",&local_5dc,
                 (unsigned_long *)&local_188);
    }
    heapString(&local_458.ownFile,*(this->func).receiveBuffer2,(size_t)local_188.ownFile.content.ptr
              );
    local_5d8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d8.value.ptr.isSet = true;
    local_5d8.value.ptr.field_1.value.content.ptr = local_458.ownFile.content.ptr;
    local_5d8.value.ptr.field_1.value.content.size_ = local_458.ownFile.content.size_;
    local_5d8.value.ptr.field_1.value.content.disposer = local_458.ownFile.content.disposer;
    local_458.ownFile.content.ptr = (char *)0x0;
    local_458.ownFile.content.size_ = 0;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_5d8);
    uVar2 = local_5d8.value.ptr.field_1.value.content.size_;
    uVar1 = local_5d8.value.ptr.field_1.value.content.ptr;
    if ((local_5d8.value.ptr.isSet == true) &&
       (local_5d8.value.ptr.field_1.value.content.ptr != (char *)0x0)) {
      local_5d8.value.ptr.field_1.value.content.ptr = (char *)0x0;
      local_5d8.value.ptr.field_1.value.content.size_ = 0;
      (**(local_5d8.value.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_5d8.value.ptr.field_1.value.content.disposer,uVar1,1,uVar2,uVar2,0);
    }
    if (local_5d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar4 = local_458.ownFile.content.size_;
    pcVar3 = local_458.ownFile.content.ptr;
    if (local_458.ownFile.content.ptr != (char *)0x0) {
      local_458.ownFile.content.ptr = (char *)0x0;
      local_458.ownFile.content.size_ = 0;
      (**(local_458.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_458.ownFile.content.disposer,pcVar3,1,sVar4,sVar4,0);
    }
  }
  if (local_2f8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2f8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }